

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_ADC(void)

{
  bool bVar1;
  Z80Reg ZVar2;
  ulong uVar3;
  Z80Reg local_48;
  byte local_39;
  int local_38 [2];
  int e [7];
  int reg2ex;
  Z80Reg reg2;
  Z80Reg reg;
  bool nonZ80CPU;
  
  local_39 = 1;
  if ((Options::IsI8080 & 1) == 0) {
    local_39 = Options::IsLR35902;
  }
  do {
    local_38[0] = -1;
    local_38[1] = -1;
    e[0] = -1;
    e[1] = -1;
    e[2] = -1;
    e[3] = -1;
    e[4] = -1;
    bVar1 = CommonAluOpcode(0x88,local_38,true,false);
    if (!bVar1) {
      ZVar2 = GetRegister(&::lp);
      if (ZVar2 == Z80_UNK) {
        return;
      }
      bVar1 = comma(&::lp);
      if (!bVar1) {
        Error("[ADC] Comma expected",(char *)0x0,PASS3);
        return;
      }
      local_48 = GetRegister(&::lp);
      if ((ZVar2 == Z80_HL) && ((local_39 & 1) == 0)) {
        if (((local_48 == Z80_BC) || (local_48 == Z80_DE)) ||
           ((local_48 == Z80_HL || (local_48 == Z80_SP)))) {
          local_38[1] = local_48 + (Z80_HL|Z80_F);
          local_38[0] = 0xed;
        }
      }
      else if (((ZVar2 == Z80_DE) &&
               ((((local_48 == Z80_BC || (local_48 == Z80_DE)) || (local_48 == Z80_HL)) ||
                (local_48 == Z80_SP)))) && (bVar1 = Options::noFakes(true), !bVar1)) {
        if ((local_48 == Z80_DE) || (local_48 == Z80_HL)) {
          local_48 = local_48 ^ Z80_BC;
        }
        e[6] = local_48;
        local_38[0] = 0xeb;
        local_38[1] = -2;
        e[1] = local_48 + (Z80_HL|Z80_F);
        e[0] = 0xed;
        e[2] = -2;
        e[3] = 0xeb;
      }
    }
    EmitBytes(local_38,true);
    uVar3 = (*DAT_001e16b0)(&::lp);
    if ((uVar3 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_ADC() {
		const bool nonZ80CPU = Options::IsI8080 || Options::IsLR35902;
		Z80Reg reg, reg2;
		int reg2ex;
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1 };
			if (!CommonAluOpcode(0x88, e, true, false)) {	// handle common 8-bit variants
				reg = GetRegister(lp);	if (Z80_UNK == reg) break;
				if (!comma(lp)) {
					Error("[ADC] Comma expected");
					break;
				}
				reg2 = GetRegister(lp);
				if (Z80_HL == reg && !nonZ80CPU) {
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						e[0] = 0xed; e[1] = 0x4a + reg2 - Z80_BC; break;
					default: break;
					}
				} else if (Z80_DE == reg) {		// fake adc de,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						reg2ex = (Z80_DE == reg2 || Z80_HL == reg2) ? (reg2^0x10) : reg2;
						e[0] = 0xEB;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0xED; e[3] = 0x4A + reg2ex - Z80_BC;
						e[4] = INSTRUCTION_START_MARKER; e[5] = 0xEB;
						break;
					default: break;
					}
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}